

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O3

void __thiscall btSoftBody::setTotalMass(btSoftBody *this,btScalar mass,bool fromfaces)

{
  uint uVar1;
  Node *pNVar2;
  Face *pFVar3;
  Node *pNVar4;
  Node *pNVar5;
  undefined1 auVar6 [16];
  ulong uVar7;
  undefined7 in_register_00000031;
  long lVar8;
  Node **ppNVar9;
  long lVar10;
  int j;
  long lVar11;
  float fVar12;
  int iVar14;
  undefined1 auVar13 [16];
  float fVar15;
  undefined1 auVar16 [16];
  float fVar17;
  undefined1 auVar18 [16];
  float fVar19;
  float fVar20;
  float fVar21;
  undefined1 auVar22 [16];
  float fVar23;
  int iVar24;
  
  auVar6 = _DAT_001ee270;
  uVar1 = (this->m_nodes).m_size;
  uVar7 = (ulong)uVar1;
  if ((int)CONCAT71(in_register_00000031,fromfaces) != 0) {
    if (0 < (int)uVar1) {
      pNVar2 = (this->m_nodes).m_data;
      lVar8 = uVar7 - 1;
      auVar13._8_4_ = (int)lVar8;
      auVar13._0_8_ = lVar8;
      auVar13._12_4_ = (int)((ulong)lVar8 >> 0x20);
      lVar8 = 0;
      auVar13 = auVar13 ^ _DAT_001ee270;
      auVar16 = _DAT_001ee5c0;
      auVar18 = _DAT_001ee5d0;
      do {
        auVar22 = auVar18 ^ auVar6;
        iVar14 = auVar13._4_4_;
        if ((bool)(~(auVar22._4_4_ == iVar14 && auVar13._0_4_ < auVar22._0_4_ ||
                    iVar14 < auVar22._4_4_) & 1)) {
          *(undefined4 *)((long)(&pNVar2->m_n + 1) + lVar8) = 0;
        }
        if ((auVar22._12_4_ != auVar13._12_4_ || auVar22._8_4_ <= auVar13._8_4_) &&
            auVar22._12_4_ <= auVar13._12_4_) {
          *(undefined4 *)((long)(&pNVar2[1].m_n + 1) + lVar8) = 0;
        }
        auVar22 = auVar16 ^ auVar6;
        iVar24 = auVar22._4_4_;
        if (iVar24 <= iVar14 && (iVar24 != iVar14 || auVar22._0_4_ <= auVar13._0_4_)) {
          *(undefined4 *)((long)(&pNVar2[2].m_n + 1) + lVar8) = 0;
          *(undefined4 *)((long)(&pNVar2[3].m_n + 1) + lVar8) = 0;
        }
        lVar10 = auVar18._8_8_;
        auVar18._0_8_ = auVar18._0_8_ + 4;
        auVar18._8_8_ = lVar10 + 4;
        lVar10 = auVar16._8_8_;
        auVar16._0_8_ = auVar16._0_8_ + 4;
        auVar16._8_8_ = lVar10 + 4;
        lVar8 = lVar8 + 0x1e0;
      } while ((ulong)(uVar1 + 3 >> 2) * 0x1e0 - lVar8 != 0);
    }
    lVar8 = (long)(this->m_faces).m_size;
    if (0 < lVar8) {
      pFVar3 = (this->m_faces).m_data;
      ppNVar9 = pFVar3->m_n;
      lVar10 = 0;
      do {
        pNVar2 = pFVar3[lVar10].m_n[0];
        pNVar4 = pFVar3[lVar10].m_n[1];
        pNVar5 = pFVar3[lVar10].m_n[2];
        fVar23 = (pNVar2->m_x).m_floats[0];
        fVar17 = (pNVar2->m_x).m_floats[1];
        fVar12 = (pNVar4->m_x).m_floats[0] - fVar23;
        fVar19 = (pNVar4->m_x).m_floats[1] - fVar17;
        fVar21 = (pNVar2->m_x).m_floats[2];
        fVar15 = (pNVar4->m_x).m_floats[2] - fVar21;
        fVar23 = (pNVar5->m_x).m_floats[0] - fVar23;
        fVar17 = (pNVar5->m_x).m_floats[1] - fVar17;
        fVar21 = (pNVar5->m_x).m_floats[2] - fVar21;
        fVar20 = fVar19 * fVar21 - fVar17 * fVar15;
        fVar21 = fVar15 * fVar23 - fVar21 * fVar12;
        fVar23 = fVar17 * fVar12 - fVar23 * fVar19;
        lVar11 = 0;
        do {
          ppNVar9[lVar11]->m_im =
               ppNVar9[lVar11]->m_im + SQRT(fVar23 * fVar23 + fVar20 * fVar20 + fVar21 * fVar21);
          lVar11 = lVar11 + 1;
        } while (lVar11 != 3);
        lVar10 = lVar10 + 1;
        ppNVar9 = ppNVar9 + 9;
      } while (lVar10 != lVar8);
    }
    if ((int)uVar1 < 1) goto LAB_001d6386;
    pNVar2 = (this->m_nodes).m_data;
    lVar8 = 0;
    do {
      *(float *)((long)(&pNVar2->m_n + 1) + lVar8) =
           1.0 / *(float *)((long)(&pNVar2->m_n + 1) + lVar8);
      lVar8 = lVar8 + 0x78;
    } while (uVar7 * 0x78 - lVar8 != 0);
  }
  if (0 < (int)uVar1) {
    fVar23 = 0.0;
    lVar8 = 0;
    do {
      fVar17 = *(float *)((long)(&((this->m_nodes).m_data)->m_n + 1) + lVar8);
      fVar23 = fVar23 + (float)(-(uint)(0.0 < fVar17) & (uint)(1.0 / fVar17));
      lVar8 = lVar8 + 0x78;
    } while (uVar7 * 0x78 - lVar8 != 0);
    if (0 < (int)uVar1) {
      pNVar2 = (this->m_nodes).m_data;
      lVar8 = 0;
      do {
        *(float *)((long)(&pNVar2->m_n + 1) + lVar8) =
             *(float *)((long)(&pNVar2->m_n + 1) + lVar8) / ((1.0 / fVar23) * mass);
        lVar8 = lVar8 + 0x78;
      } while (uVar7 * 0x78 - lVar8 != 0);
    }
  }
LAB_001d6386:
  this->m_bUpdateRtCst = true;
  return;
}

Assistant:

void			btSoftBody::setTotalMass(btScalar mass,bool fromfaces)
{
	int i;

	if(fromfaces)
	{

		for(i=0;i<m_nodes.size();++i)
		{
			m_nodes[i].m_im=0;
		}
		for(i=0;i<m_faces.size();++i)
		{
			const Face&		f=m_faces[i];
			const btScalar	twicearea=AreaOf(	f.m_n[0]->m_x,
				f.m_n[1]->m_x,
				f.m_n[2]->m_x);
			for(int j=0;j<3;++j)
			{
				f.m_n[j]->m_im+=twicearea;
			}
		}
		for( i=0;i<m_nodes.size();++i)
		{
			m_nodes[i].m_im=1/m_nodes[i].m_im;
		}
	}
	const btScalar	tm=getTotalMass();
	const btScalar	itm=1/tm;
	for( i=0;i<m_nodes.size();++i)
	{
		m_nodes[i].m_im/=itm*mass;
	}
	m_bUpdateRtCst=true;
}